

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int createCollation(sqlite3 *db,char *zName,u8 enc,void *pCtx,
                   _func_int_void_ptr_int_void_ptr_int_void_ptr *xCompare,_func_void_void_ptr *xDel)

{
  char cVar1;
  code *pcVar2;
  CollSeq *pCVar3;
  Vdbe *pVVar4;
  void *pvVar5;
  char *pcVar6;
  long lVar7;
  uint uVar8;
  byte enc_00;
  int err_code;
  uint uVar9;
  int iVar10;
  
  if (zName == (char *)0x0) {
    uVar9 = 0;
  }
  else {
    uVar9 = 0xffffffff;
    pcVar6 = zName;
    do {
      uVar9 = uVar9 + 1;
      cVar1 = *pcVar6;
      pcVar6 = pcVar6 + 1;
    } while (cVar1 != '\0');
    uVar9 = uVar9 & 0x3fffffff;
  }
  uVar8 = 2;
  if ((enc - 4 & 0xfb) != 0) {
    uVar8 = (uint)enc;
  }
  if (uVar8 - 4 < 0xfffffffd) {
    sqlite3_log(0x15,"misuse at line %d of [%.10s]",0x1c80f,
                "118a3b35693b134d56ebd780123b7fd6f1497668");
    return 0x15;
  }
  enc_00 = (byte)uVar8;
  pCVar3 = sqlite3FindCollSeq(db,enc_00,zName,0);
  if ((pCVar3 != (CollSeq *)0x0) &&
     (pCVar3->xCmp != (_func_int_void_ptr_int_void_ptr_int_void_ptr *)0x0)) {
    if (db->activeVdbeCnt != 0) {
      pcVar6 = "unable to delete/modify collation sequence due to active statements";
      iVar10 = 5;
      err_code = 5;
      goto LAB_00128349;
    }
    for (pVVar4 = db->pVdbe; pVVar4 != (Vdbe *)0x0; pVVar4 = pVVar4->pNext) {
      pVVar4->field_0x9a = pVVar4->field_0x9a | 0x20;
    }
    if (uVar8 == (pCVar3->enc & 0xfffffff7)) {
      pvVar5 = sqlite3HashFind(&db->aCollSeq,zName,uVar9);
      lVar7 = 0;
      do {
        if (*(u8 *)((long)pvVar5 + lVar7 + 8) == pCVar3->enc) {
          pcVar2 = *(code **)((long)pvVar5 + lVar7 + 0x20);
          if (pcVar2 != (code *)0x0) {
            (*pcVar2)(*(undefined8 *)((long)pvVar5 + lVar7 + 0x10));
          }
          *(undefined8 *)((long)pvVar5 + lVar7 + 0x18) = 0;
        }
        lVar7 = lVar7 + 0x28;
      } while (lVar7 != 0x78);
    }
  }
  pCVar3 = sqlite3FindCollSeq(db,enc_00,zName,1);
  if (pCVar3 == (CollSeq *)0x0) {
    return 7;
  }
  pCVar3->xCmp = xCompare;
  pCVar3->pUser = pCtx;
  pCVar3->xDel = xDel;
  pCVar3->enc = enc_00 | enc & 8;
  iVar10 = 0;
  err_code = 0;
  pcVar6 = (char *)0x0;
LAB_00128349:
  sqlite3Error(db,err_code,pcVar6);
  return iVar10;
}

Assistant:

static int createCollation(
  sqlite3* db,
  const char *zName, 
  u8 enc,
  void* pCtx,
  int(*xCompare)(void*,int,const void*,int,const void*),
  void(*xDel)(void*)
){
  CollSeq *pColl;
  int enc2;
  int nName = sqlite3Strlen30(zName);
  
  assert( sqlite3_mutex_held(db->mutex) );

  /* If SQLITE_UTF16 is specified as the encoding type, transform this
  ** to one of SQLITE_UTF16LE or SQLITE_UTF16BE using the
  ** SQLITE_UTF16NATIVE macro. SQLITE_UTF16 is not used internally.
  */
  enc2 = enc;
  testcase( enc2==SQLITE_UTF16 );
  testcase( enc2==SQLITE_UTF16_ALIGNED );
  if( enc2==SQLITE_UTF16 || enc2==SQLITE_UTF16_ALIGNED ){
    enc2 = SQLITE_UTF16NATIVE;
  }
  if( enc2<SQLITE_UTF8 || enc2>SQLITE_UTF16BE ){
    return SQLITE_MISUSE_BKPT;
  }

  /* Check if this call is removing or replacing an existing collation 
  ** sequence. If so, and there are active VMs, return busy. If there
  ** are no active VMs, invalidate any pre-compiled statements.
  */
  pColl = sqlite3FindCollSeq(db, (u8)enc2, zName, 0);
  if( pColl && pColl->xCmp ){
    if( db->activeVdbeCnt ){
      sqlite3Error(db, SQLITE_BUSY, 
        "unable to delete/modify collation sequence due to active statements");
      return SQLITE_BUSY;
    }
    sqlite3ExpirePreparedStatements(db);

    /* If collation sequence pColl was created directly by a call to
    ** sqlite3_create_collation, and not generated by synthCollSeq(),
    ** then any copies made by synthCollSeq() need to be invalidated.
    ** Also, collation destructor - CollSeq.xDel() - function may need
    ** to be called.
    */ 
    if( (pColl->enc & ~SQLITE_UTF16_ALIGNED)==enc2 ){
      CollSeq *aColl = sqlite3HashFind(&db->aCollSeq, zName, nName);
      int j;
      for(j=0; j<3; j++){
        CollSeq *p = &aColl[j];
        if( p->enc==pColl->enc ){
          if( p->xDel ){
            p->xDel(p->pUser);
          }
          p->xCmp = 0;
        }
      }
    }
  }

  pColl = sqlite3FindCollSeq(db, (u8)enc2, zName, 1);
  if( pColl==0 ) return SQLITE_NOMEM;
  pColl->xCmp = xCompare;
  pColl->pUser = pCtx;
  pColl->xDel = xDel;
  pColl->enc = (u8)(enc2 | (enc & SQLITE_UTF16_ALIGNED));
  sqlite3Error(db, SQLITE_OK, 0);
  return SQLITE_OK;
}